

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_primitive.cc
# Opt level: O2

string * __thiscall
PPConstDef::ToCode_abi_cxx11_(string *__return_storage_ptr__,PPConstDef *this,Env *env)

{
  Type *data_type;
  char *pcVar1;
  char *pcVar2;
  string type_str;
  
  data_type = Expr::DataType(this->expr_,env);
  Env::AddID(env,this->id_,TEMP_VAR,data_type);
  Env::SetEvaluated(env,this->id_,true);
  (*(data_type->super_DataDepElement)._vptr_DataDepElement[0xb])(&type_str,data_type);
  pcVar1 = Env::LValue(env,this->id_);
  pcVar2 = Expr::EvalExpr(this->expr_,(Output *)0x0,env);
  strfmt_abi_cxx11_(__return_storage_ptr__,"%s %s = %s",type_str._M_dataplus._M_p,pcVar1,pcVar2);
  std::__cxx11::string::~string((string *)&type_str);
  return __return_storage_ptr__;
}

Assistant:

string PPConstDef::ToCode(Env* env)
	{
	Type* type = expr_->DataType(env);
	env->AddID(id_, TEMP_VAR, type);
	env->SetEvaluated(id_);

	string type_str = type->DataTypeStr();
	return strfmt("%s %s = %s", type_str.c_str(), env->LValue(id_), expr_->EvalExpr(nullptr, env));
	}